

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O1

EStatusCode __thiscall CFFFileInput::ReadEncodings(CFFFileInput *this)

{
  pointer *pppEVar1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  iterator __position;
  EStatusCode EVar4;
  long inEncodingPosition;
  _Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_> _Var5;
  _Base_ptr p_Var6;
  _Rb_tree_header *p_Var7;
  ulong uVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_long_long,_EncodingsInfo_*>_>,_bool> pVar9;
  EncodingsInfo *encoding;
  LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
  EncodingsInfo *local_80;
  vector<EncodingsInfo*,std::allocator<EncodingsInfo*>> *local_78;
  pair<const_long_long,_EncodingsInfo_*> local_70;
  _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (this->mFontsCount != 0) {
    local_78 = (vector<EncodingsInfo*,std::allocator<EncodingsInfo*>> *)&this->mEncodings;
    uVar8 = 0;
    do {
      inEncodingPosition = GetSingleIntegerValue(this,(unsigned_short)uVar8,0x10,0);
      p_Var6 = &p_Var2->_M_header;
      for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var3 != (_Rb_tree_header *)0x0;
          p_Var3 = (&p_Var3->_M_left)[(long)*(size_t *)(p_Var3 + 1) < inEncodingPosition]) {
        if (inEncodingPosition <= (long)*(size_t *)(p_Var3 + 1)) {
          p_Var6 = p_Var3;
        }
      }
      _Var5._M_node = &p_Var2->_M_header;
      if (((_Rb_tree_header *)p_Var6 != p_Var2) &&
         (_Var5._M_node = p_Var6, inEncodingPosition < (long)*(size_t *)(p_Var6 + 1))) {
        _Var5._M_node = &p_Var2->_M_header;
      }
      if ((_Rb_tree_header *)_Var5._M_node == p_Var2) {
        local_80 = (EncodingsInfo *)operator_new(0x50);
        p_Var7 = &(local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0x0;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &p_Var7->_M_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             &p_Var7->_M_header;
        (local_80->mSupplements)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_80->mEncoding = (Byte *)0x0;
        ReadEncoding(this,local_80,inEncodingPosition);
        __position._M_current =
             (this->mEncodings).
             super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->mEncodings).super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<EncodingsInfo*,std::allocator<EncodingsInfo*>>::
          _M_realloc_insert<EncodingsInfo*const&>(local_78,__position,&local_80);
        }
        else {
          *__position._M_current = local_80;
          pppEVar1 = &(this->mEncodings).
                      super__Vector_base<EncodingsInfo_*,_std::allocator<EncodingsInfo_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppEVar1 = *pppEVar1 + 1;
        }
        local_70.second = local_80;
        local_70.first = inEncodingPosition;
        pVar9 = std::
                _Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
                ::_M_insert_unique<std::pair<long_long_const,EncodingsInfo*>>
                          ((_Rb_tree<long_long,std::pair<long_long_const,EncodingsInfo*>,std::_Select1st<std::pair<long_long_const,EncodingsInfo*>>,std::less<long_long>,std::allocator<std::pair<long_long_const,EncodingsInfo*>>>
                            *)&local_60,&local_70);
        _Var5 = pVar9.first._M_node;
      }
      this->mTopDictIndex[uVar8].mEncoding = (EncodingsInfo *)_Var5._M_node[1]._M_parent;
      uVar8 = uVar8 + 1;
    } while (uVar8 < this->mFontsCount);
  }
  EVar4 = CFFPrimitiveReader::GetInternalState(&this->mPrimitivesReader);
  std::
  _Rb_tree<long_long,_std::pair<const_long_long,_EncodingsInfo_*>,_std::_Select1st<std::pair<const_long_long,_EncodingsInfo_*>_>,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_EncodingsInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  return EVar4;
}

Assistant:

EStatusCode CFFFileInput::ReadEncodings()
{
	// read all encodings positions
	EStatusCode status = PDFHummus::eSuccess;
	LongFilePositionTypeToEncodingsInfoMap offsetToEncoding;
	LongFilePositionTypeToEncodingsInfoMap::iterator it;

	for(unsigned long i=0; i < mFontsCount && (PDFHummus::eSuccess == status); ++i)
	{
		LongFilePositionType encodingPosition = GetEncodingPosition(i);
		it = offsetToEncoding.find(encodingPosition);
		if(it == offsetToEncoding.end())
		{
			EncodingsInfo* encoding = new EncodingsInfo();
			ReadEncoding(encoding,encodingPosition);
			mEncodings.push_back(encoding);
			it = offsetToEncoding.insert(LongFilePositionTypeToEncodingsInfoMap::value_type(encodingPosition,encoding)).first;
		}
		mTopDictIndex[i].mEncoding = it->second;
	}

	if(status != PDFHummus::eSuccess)
		return status;
	else
		return mPrimitivesReader.GetInternalState();

}